

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsMatrixPic.cpp
# Opt level: O2

HighsStatus
writeMatrixPicToFile
          (HighsOptions *options,string *fileprefix,HighsInt numRow,HighsInt numCol,
          vector<int,_std::allocator<int>_> *Astart,vector<int,_std::allocator<int>_> *Aindex)

{
  uint uVar1;
  int iVar2;
  pointer piVar3;
  pointer piVar4;
  HighsStatus HVar5;
  ulong uVar6;
  ulong uVar7;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  vector<int,_std::allocator<int>_> ARindex;
  vector<int,_std::allocator<int>_> ARstart;
  vector<int,_std::allocator<int>_> ARlength;
  _Vector_base<int,_std::allocator<int>_> local_c8;
  _Vector_base<int,_std::allocator<int>_> local_a8;
  _Vector_base<int,_std::allocator<int>_> local_88;
  HighsOptions *local_68;
  string *local_60;
  value_type_conflict2 local_54;
  string local_50;
  
  local_88._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_c8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_c8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar1 = (Astart->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
          _M_start[numCol];
  local_54 = 0;
  local_68 = options;
  local_60 = fileprefix;
  std::vector<int,_std::allocator<int>_>::_M_fill_assign
            ((vector<int,_std::allocator<int>_> *)&local_88,(long)numRow,&local_54);
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)&local_a8,(long)(numRow + 1));
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)&local_c8,(long)(int)uVar1);
  piVar3 = (Aindex->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  uVar7 = 0;
  uVar6 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar6 = uVar7;
  }
  for (; uVar6 != uVar7; uVar7 = uVar7 + 1) {
    local_88._M_impl.super__Vector_impl_data._M_start[piVar3[uVar7]] =
         local_88._M_impl.super__Vector_impl_data._M_start[piVar3[uVar7]] + 1;
  }
  *local_a8._M_impl.super__Vector_impl_data._M_start = 0;
  iVar8 = 0;
  uVar6 = 0;
  if (0 < numRow) {
    uVar6 = (ulong)(uint)numRow;
  }
  for (uVar7 = 0; uVar6 != uVar7; uVar7 = uVar7 + 1) {
    iVar8 = iVar8 + local_88._M_impl.super__Vector_impl_data._M_start[uVar7];
    local_a8._M_impl.super__Vector_impl_data._M_start[uVar7 + 1] = iVar8;
  }
  piVar3 = (Astart->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  uVar10 = 0;
  uVar7 = 0;
  if (0 < numCol) {
    uVar10 = (ulong)(uint)numCol;
  }
  while (uVar9 = uVar7, uVar9 != uVar10) {
    piVar4 = (Aindex->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
             ._M_start;
    for (lVar11 = (long)piVar3[uVar9]; uVar7 = uVar9 + 1, lVar11 < piVar3[uVar9 + 1];
        lVar11 = lVar11 + 1) {
      iVar8 = piVar4[lVar11];
      iVar2 = local_a8._M_impl.super__Vector_impl_data._M_start[iVar8];
      local_a8._M_impl.super__Vector_impl_data._M_start[iVar8] = iVar2 + 1;
      local_c8._M_impl.super__Vector_impl_data._M_start[iVar2] = (int)uVar9;
    }
  }
  *local_a8._M_impl.super__Vector_impl_data._M_start = 0;
  iVar8 = 0;
  for (uVar7 = 0; uVar6 != uVar7; uVar7 = uVar7 + 1) {
    iVar8 = iVar8 + local_88._M_impl.super__Vector_impl_data._M_start[uVar7];
    local_a8._M_impl.super__Vector_impl_data._M_start[uVar7 + 1] = iVar8;
  }
  std::__cxx11::string::string((string *)&local_50,(string *)local_60);
  HVar5 = writeRmatrixPicToFile
                    (local_68,&local_50,numRow,numCol,(vector<int,_std::allocator<int>_> *)&local_a8
                     ,(vector<int,_std::allocator<int>_> *)&local_c8);
  std::__cxx11::string::~string((string *)&local_50);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_c8);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_a8);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_88);
  return HVar5;
}

Assistant:

HighsStatus writeMatrixPicToFile(const HighsOptions& options,
                                 const std::string fileprefix,
                                 const HighsInt numRow, const HighsInt numCol,
                                 const std::vector<HighsInt>& Astart,
                                 const std::vector<HighsInt>& Aindex) {
  std::vector<HighsInt> ARlength;
  std::vector<HighsInt> ARstart;
  std::vector<HighsInt> ARindex;
  assert(numRow > 0);
  assert(numCol > 0);
  const HighsInt numNz = Astart[numCol];
  ARlength.assign(numRow, 0);
  ARstart.resize(numRow + 1);
  ARindex.resize(numNz);
  for (HighsInt iEl = 0; iEl < numNz; iEl++) ARlength[Aindex[iEl]]++;
  ARstart[0] = 0;
  for (HighsInt iRow = 0; iRow < numRow; iRow++)
    ARstart[iRow + 1] = ARstart[iRow] + ARlength[iRow];
  for (HighsInt iCol = 0; iCol < numCol; iCol++) {
    for (HighsInt iEl = Astart[iCol]; iEl < Astart[iCol + 1]; iEl++) {
      HighsInt iRow = Aindex[iEl];
      ARindex[ARstart[iRow]++] = iCol;
    }
  }
  ARstart[0] = 0;
  for (HighsInt iRow = 0; iRow < numRow; iRow++)
    ARstart[iRow + 1] = ARstart[iRow] + ARlength[iRow];

  return writeRmatrixPicToFile(options, fileprefix, numRow, numCol, ARstart,
                               ARindex);
}